

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_common.c
# Opt level: O3

XVisualInfo * get_glx_visual(Display *dpy)

{
  undefined8 uVar1;
  XVisualInfo *pXVar2;
  undefined8 *puVar3;
  int attrib [9];
  undefined1 auStack_b8 [8];
  undefined8 uStack_b0;
  undefined8 uStack_a0;
  undefined8 uStack_70;
  undefined8 uStack_58;
  
  puVar3 = (undefined8 *)(ulong)*(uint *)(dpy + 0xe0);
  pXVar2 = (XVisualInfo *)(*_epoxy_glXChooseVisual)();
  if (pXVar2 != (XVisualInfo *)0x0) {
    return pXVar2;
  }
  get_glx_visual_cold_1();
  uVar1 = *(undefined8 *)(*(long *)(dpy + 0xe8) + 0x10 + (long)*(int *)(dpy + 0xe0) * 0x80);
  uStack_b0 = 0;
  uStack_a0 = 0;
  uStack_58 = XCreateColormap();
  uStack_70 = 0x28001;
  pXVar2 = (XVisualInfo *)
           XCreateWindow(dpy,uVar1,0,0,10,10,0,*(undefined4 *)((long)puVar3 + 0x14),1,*puVar3,0x280a
                         ,auStack_b8);
  return pXVar2;
}

Assistant:

XVisualInfo *
get_glx_visual(Display *dpy)
{
	XVisualInfo *visinfo;
	int attrib[] = {
		GLX_RGBA,
		GLX_RED_SIZE, 1,
		GLX_GREEN_SIZE, 1,
		GLX_BLUE_SIZE, 1,
		GLX_DOUBLEBUFFER,
		None
	};
	int screen = DefaultScreen(dpy);

	visinfo = glXChooseVisual(dpy, screen, attrib);
	if (visinfo == NULL) {
		fprintf(stderr,
			"Couldn't get an RGBA, double-buffered visual\n");
		exit(1);
	}

	return visinfo;
}